

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::detail::tlssPush(void)

{
  ostream *poVar1;
  anon_class_416_2_abd2a4d0 *in_stack_00000020;
  
  g_oss();
  poVar1 = anon_class_416_2_abd2a4d0::push(in_stack_00000020);
  return poVar1;
}

Assistant:

std::ostream* tlssPush() {
        return g_oss.push();
    }